

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdlvideo.cpp
# Opt level: O0

void __thiscall SDLFB::ResetSDLRenderer(SDLFB *this)

{
  SDL_Window *pSVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  SDL_Renderer *pSVar5;
  SDL_Texture *pSVar6;
  int local_34;
  int local_30;
  int h;
  int w;
  int bpp;
  Uint32 Amask;
  Uint32 Bmask;
  Uint32 Gmask;
  Uint32 Rmask;
  Uint32 format;
  Uint32 fmt;
  SDLFB *this_local;
  
  _format = this;
  if (this->Renderer != (SDL_Renderer *)0x0) {
    if ((this->field_8).Texture != (SDL_Texture *)0x0) {
      SDL_DestroyTexture((this->field_8).Texture);
    }
    SDL_DestroyRenderer(this->Renderer);
  }
  bVar2 = FBoolCVar::operator_cast_to_bool(&vid_forcesurface);
  this->UsingRenderer = (bool)((bVar2 ^ 0xffU) & 1);
  if ((this->UsingRenderer & 1U) == 0) {
    pSVar6 = (SDL_Texture *)SDL_GetWindowSurface(this->Screen);
    (this->field_8).Texture = pSVar6;
    if (((this->field_8).Surface)->format->palette == (SDL_Palette *)0x0) {
      this->NotPaletted = true;
      PfxState::SetFormat(&GPfx,(uint)((this->field_8).Surface)->format->BitsPerPixel,
                          ((this->field_8).Surface)->format->Rmask,
                          ((this->field_8).Surface)->format->Gmask,
                          ((this->field_8).Surface)->format->Bmask);
    }
    else {
      this->NotPaletted = false;
    }
  }
  else {
    pSVar1 = this->Screen;
    bVar2 = FBoolCVar::operator_cast_to_bool(&vid_vsync);
    uVar4 = 0;
    if (bVar2) {
      uVar4 = 4;
    }
    pSVar5 = (SDL_Renderer *)SDL_CreateRenderer(pSVar1,0xffffffff,uVar4 | 10);
    this->Renderer = pSVar5;
    if (this->Renderer == (SDL_Renderer *)0x0) {
      return;
    }
    SDL_SetRenderDrawColor(this->Renderer,0,0,0,0xff);
    iVar3 = FIntCVar::operator_cast_to_int(&vid_displaybits);
    switch(iVar3) {
    case 0xf:
      Rmask = 0x15331002;
      break;
    case 0x10:
      Rmask = 0x15151002;
      break;
    default:
      Rmask = 0x16362004;
      break;
    case 0x18:
      Rmask = 0x16161804;
      break;
    case 0x1e:
      Rmask = 0x16372004;
    }
    pSVar6 = (SDL_Texture *)
             SDL_CreateTexture(this->Renderer,Rmask,1,
                               (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                               (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height);
    (this->field_8).Texture = pSVar6;
    this->NotPaletted = true;
    SDL_QueryTexture((this->field_8).Texture,&Gmask,0,0);
    SDL_PixelFormatEnumToMasks(Gmask,&h,&Bmask,&Amask,&bpp,&w);
    PfxState::SetFormat(&GPfx,h,Bmask,Amask,bpp);
  }
  uVar4 = (*(this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.super_DObject._vptr_DObject
            [0x21])();
  if ((uVar4 & 1) != 0) {
    SDL_GetWindowSize(this->Screen,&local_30,&local_34);
    ScaleWithAspect(&local_30,&local_34,
                    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Width,
                    (this->super_DFrameBuffer).super_DSimpleCanvas.super_DCanvas.Height);
    SDL_RenderSetLogicalSize(this->Renderer,local_30,local_34);
  }
  return;
}

Assistant:

void SDLFB::ResetSDLRenderer ()
{
	if (Renderer)
	{
		if (Texture)
			SDL_DestroyTexture (Texture);
		SDL_DestroyRenderer (Renderer);
	}

	UsingRenderer = !vid_forcesurface;
	if (UsingRenderer)
	{
		Renderer = SDL_CreateRenderer (Screen, -1,SDL_RENDERER_ACCELERATED|SDL_RENDERER_TARGETTEXTURE|
										(vid_vsync ? SDL_RENDERER_PRESENTVSYNC : 0));
		if (!Renderer)
			return;

		SDL_SetRenderDrawColor(Renderer, 0, 0, 0, 255);

		Uint32 fmt;
		switch(vid_displaybits)
		{
			default: fmt = SDL_PIXELFORMAT_ARGB8888; break;
			case 30: fmt = SDL_PIXELFORMAT_ARGB2101010; break;
			case 24: fmt = SDL_PIXELFORMAT_RGB888; break;
			case 16: fmt = SDL_PIXELFORMAT_RGB565; break;
			case 15: fmt = SDL_PIXELFORMAT_ARGB1555; break;
		}
		Texture = SDL_CreateTexture (Renderer, fmt, SDL_TEXTUREACCESS_STREAMING, Width, Height);

		{
			NotPaletted = true;

			Uint32 format;
			SDL_QueryTexture(Texture, &format, NULL, NULL, NULL);

			Uint32 Rmask, Gmask, Bmask, Amask;
			int bpp;
			SDL_PixelFormatEnumToMasks(format, &bpp, &Rmask, &Gmask, &Bmask, &Amask);
			GPfx.SetFormat (bpp, Rmask, Gmask, Bmask);
		}
	}
	else
	{
		Surface = SDL_GetWindowSurface (Screen);

		if (Surface->format->palette == NULL)
		{
			NotPaletted = true;
			GPfx.SetFormat (Surface->format->BitsPerPixel, Surface->format->Rmask, Surface->format->Gmask, Surface->format->Bmask);
		}
		else
			NotPaletted = false;
	}

	// In fullscreen, set logical size according to animorphic ratio.
	// Windowed modes are rendered to fill the window (usually 1:1)
	if (IsFullscreen ())
	{
		int w, h;
		SDL_GetWindowSize (Screen, &w, &h);
		ScaleWithAspect (w, h, Width, Height);
		SDL_RenderSetLogicalSize (Renderer, w, h);
	}
}